

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

target_ulong helper_mftdsp_mips64el(CPUMIPSState_conflict5 *env)

{
  CPUMIPSState_conflict5 *pCVar1;
  CPUMIPSState_conflict5 *other;
  CPUMIPSState_conflict5 *pCStack_18;
  int other_tc;
  CPUMIPSState_conflict5 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  pCStack_18 = env;
  pCVar1 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  if (other._4_4_ == pCVar1->current_tc) {
    env_local = (CPUMIPSState_conflict5 *)(pCVar1->active_tc).DSPControl;
  }
  else {
    env_local = (CPUMIPSState_conflict5 *)pCVar1->tcs[(int)other._4_4_].DSPControl;
  }
  return (target_ulong)env_local;
}

Assistant:

target_ulong helper_mftdsp(CPUMIPSState *env)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        return other->active_tc.DSPControl;
    } else {
        return other->tcs[other_tc].DSPControl;
    }
}